

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O3

int mg_dns_encode_name(mbuf *io,char *name,size_t len)

{
  size_t sVar1;
  char cVar2;
  ulong in_RAX;
  char *pcVar3;
  byte bVar4;
  char *pcVar5;
  uchar n;
  undefined8 uStack_38;
  
  sVar1 = io->len;
  uStack_38 = in_RAX;
  do {
    pcVar3 = strchr(name,0x2e);
    pcVar5 = name + len;
    if (pcVar3 != (char *)0x0) {
      pcVar5 = pcVar3;
    }
    if (0x7f < (long)pcVar5 - (long)name) {
      return -1;
    }
    uStack_38 = CONCAT17((char)((long)pcVar5 - (long)name),(undefined7)uStack_38);
    mbuf_insert(io,io->len,(void *)((long)&uStack_38 + 7),1);
    mbuf_insert(io,io->len,name,uStack_38 >> 0x38);
    cVar2 = *pcVar5;
    bVar4 = uStack_38._7_1_;
    if (cVar2 == '.') {
      bVar4 = uStack_38._7_1_ + 1;
      uStack_38 = CONCAT17(bVar4,(undefined7)uStack_38);
      cVar2 = *pcVar5;
    }
    name = name + bVar4;
    len = len - bVar4;
  } while (cVar2 != '\0');
  mbuf_insert(io,io->len,"",1);
  return (int)io->len - (int)sVar1;
}

Assistant:

static int mg_dns_encode_name(struct mbuf *io, const char *name, size_t len) {
    const char *s;
    unsigned char n;
    size_t pos = io->len;

    do {
        if ((s = strchr(name, '.')) == NULL) {
            s = name + len;
        }

        if (s - name > 127) {
            return -1; /* TODO(mkm) cover */
        }
        n = s - name;           /* chunk length */
        mbuf_append(io, &n, 1); /* send length */
        mbuf_append(io, name, n);

        if (*s == '.') {
            n++;
        }

        name += n;
        len -= n;
    } while (*s != '\0');
    mbuf_append(io, "\0", 1); /* Mark end of host name */

    return io->len - pos;
}